

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

size_type __thiscall
phmap::priv::
btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
::internal_verify(btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                  *this,node_type *node,key_type *lo,key_type *hi)

{
  node_type nVar1;
  node_type nVar2;
  btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  *pbVar3;
  size_type sVar4;
  node_type nVar5;
  ulong uVar6;
  node_type *hi_00;
  char *__function;
  ulong uVar7;
  node_type *lo_00;
  node_type *pnVar8;
  size_type sVar9;
  bool bVar10;
  
  if (((ulong)node & 7) != 0) {
LAB_00205d79:
    __function = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
    ;
LAB_00205e02:
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0xf84,__function);
  }
  nVar1 = node[10];
  sVar9 = (size_type)(byte)nVar1;
  if (sVar9 == 0) {
    __assert_fail("node->count() > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xca3,
                  "typename btree<P>::size_type phmap::priv::btree<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>>::internal_verify(const node_type *, const key_type *, const key_type *) const [Params = phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>]"
                 );
  }
  nVar2 = node[0xb];
  nVar5 = (node_type)0x1e;
  if (nVar2 != (node_type)0x0) {
    nVar5 = nVar2;
  }
  if ((byte)nVar5 < (byte)nVar1) {
    __assert_fail("node->count() <= node->max_count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xca4,
                  "typename btree<P>::size_type phmap::priv::btree<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>>::internal_verify(const node_type *, const key_type *, const key_type *) const [Params = phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>]"
                 );
  }
  if ((lo != (key_type *)0x0) && (*(int *)(node + 0xc) < *lo)) {
    __assert_fail("!compare_keys(node->key(0), *lo)",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xca6,
                  "typename btree<P>::size_type phmap::priv::btree<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>>::internal_verify(const node_type *, const key_type *, const key_type *) const [Params = phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>]"
                 );
  }
  if ((hi != (key_type *)0x0) && (*hi < *(int *)(node + sVar9 * 8 + 4))) {
    __assert_fail("!compare_keys(*hi, node->key(node->count() - 1))",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xca9,
                  "typename btree<P>::size_type phmap::priv::btree<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>>::internal_verify(const node_type *, const key_type *, const key_type *) const [Params = phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>]"
                 );
  }
  if ((byte)nVar1 != 1) {
    uVar6 = 2;
    if (2 < (byte)nVar1) {
      uVar6 = (ulong)(uint)(byte)nVar1;
    }
    uVar7 = 1;
    do {
      if (*(int *)(node + uVar7 * 8 + 0xc) < *(int *)(node + uVar7 * 8 + 4)) {
        __assert_fail("!compare_keys(node->key(i), node->key(i - 1))",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xcac,
                      "typename btree<P>::size_type phmap::priv::btree<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>>::internal_verify(const node_type *, const key_type *, const key_type *) const [Params = phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>]"
                     );
      }
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  if (nVar2 == (node_type)0x0) {
    pnVar8 = node + 0xc;
    uVar6 = 0;
    do {
      pbVar3 = btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
               ::child(node,uVar6);
      if (pbVar3 == (btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                     *)0x0) {
        __assert_fail("node->child(i) != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xcb1,
                      "typename btree<P>::size_type phmap::priv::btree<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>>::internal_verify(const node_type *, const key_type *, const key_type *) const [Params = phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>]"
                     );
      }
      pbVar3 = btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
               ::child(node,uVar6);
      if (((ulong)pbVar3 & 7) != 0) {
        __function = 
        "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
        ;
        goto LAB_00205e02;
      }
      if (*(node_type **)pbVar3 != node) {
        __assert_fail("node->child(i)->parent() == node",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xcb2,
                      "typename btree<P>::size_type phmap::priv::btree<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>>::internal_verify(const node_type *, const key_type *, const key_type *) const [Params = phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>]"
                     );
      }
      pbVar3 = btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
               ::child(node,uVar6);
      if (((ulong)pbVar3 & 7) != 0) goto LAB_00205d79;
      if (uVar6 != (byte)pbVar3[8]) {
        __assert_fail("node->child(i)->position() == i",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xcb3,
                      "typename btree<P>::size_type phmap::priv::btree<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>>::internal_verify(const node_type *, const key_type *, const key_type *) const [Params = phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>]"
                     );
      }
      pbVar3 = btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
               ::child(node,uVar6);
      lo_00 = pnVar8 + -8;
      if (uVar6 == 0) {
        lo_00 = (node_type *)lo;
      }
      hi_00 = pnVar8;
      if (uVar6 == (byte)node[10]) {
        hi_00 = (node_type *)hi;
      }
      sVar4 = internal_verify(this,pbVar3,(key_type *)lo_00,(key_type *)hi_00);
      sVar9 = sVar9 + sVar4;
      pnVar8 = pnVar8 + 8;
      bVar10 = uVar6 < (byte)node[10];
      uVar6 = uVar6 + 1;
    } while (bVar10);
  }
  return sVar9;
}

Assistant:

typename btree<P>::size_type btree<P>::internal_verify(
        const node_type *node, const key_type *lo, const key_type *hi) const {
        assert(node->count() > 0);
        assert(node->count() <= node->max_count());
        if (lo) {
            assert(!compare_keys(node->key(0), *lo));
        }
        if (hi) {
            assert(!compare_keys(*hi, node->key(node->count() - 1)));
        }
        for (int i = 1; i < node->count(); ++i) {
            assert(!compare_keys(node->key(i), node->key(i - 1)));
        }
        size_type count = node->count();
        if (!node->leaf()) {
            for (int i = 0; i <= node->count(); ++i) {
                assert(node->child(i) != nullptr);
                assert(node->child(i)->parent() == node);
                assert(node->child(i)->position() == i);
                count += internal_verify(
                    node->child(i),
                    (i == 0) ? lo : &node->key(i - 1),
                    (i == node->count()) ? hi : &node->key(i));
            }
        }
        return count;
    }